

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O0

bool Rct::readFile(Path *path,String *data,mode_t *perm)

{
  bool bVar1;
  char *__filename;
  FILE *__stream;
  bool ret;
  FILE *f;
  mode_t *perm_local;
  String *data_local;
  Path *path_local;
  
  bVar1 = Path::isFile(path);
  if (bVar1) {
    __filename = String::nullTerminated(&path->super_String);
    __stream = fopen(__filename,"r");
    if (__stream == (FILE *)0x0) {
      path_local._7_1_ = false;
    }
    else {
      path_local._7_1_ = readFile((FILE *)__stream,data,perm);
      fclose(__stream);
    }
  }
  else {
    path_local._7_1_ = false;
  }
  return path_local._7_1_;
}

Assistant:

bool readFile(const Path& path, String& data, mode_t *perm)
{
    if (!path.isFile())
        return false;
    FILE *f = fopen(path.nullTerminated(), "r");
    if (!f)
        return false;
    const bool ret = readFile(f, data, perm);
    fclose(f);
    return ret;
}